

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t_backend.hpp
# Opt level: O2

number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
* std::
  numeric_limits<boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>_>
  ::max(void)

{
  number<boost::multiprecision::uintwide_t_backend<16384U,_unsigned_int,_std::allocator<unsigned_int>_>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_40;
  dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> local_28;
  
  math::wide_integer::uintwide_t<16384U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
  limits_helper_max<false>();
  math::wide_integer::detail::fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_>
  ::fixed_dynamic_array
            ((fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_> *)&local_40,
             (fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_> *)&local_28);
  math::wide_integer::detail::fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_>
  ::fixed_dynamic_array
            ((fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_> *)in_RDI,
             (fixed_dynamic_array<unsigned_int,_512U,_std::allocator<unsigned_int>_> *)&local_40);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            (&local_40);
  util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::~dynamic_array
            (&local_28);
  return in_RDI;
}

Assistant:

static constexpr auto (max)        () -> boost::multiprecision::number<boost::multiprecision::uintwide_t_backend<MyWidth2, MyLimbType, MyAllocatorType>, ExpressionTemplatesOptions> { return boost::multiprecision::uintwide_t_backend<MyWidth2, MyLimbType, MyAllocatorType>((std::numeric_limits<::math::wide_integer::uintwide_t<MyWidth2, MyLimbType, MyAllocatorType>>::max)()       ); }